

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# screen.c
# Opt level: O3

void set_colour_bits(void)

{
  code *pcVar1;
  
  if (teletext != '\0') {
    return;
  }
  colour_bits = crt_regs[1] / disp_chars;
  if (colour_bits == 1) {
    pcVar1 = screen_byte_1;
  }
  else if (colour_bits == 4) {
    pcVar1 = screen_byte_4;
  }
  else {
    if (colour_bits != 2) {
      return;
    }
    pcVar1 = screen_byte_2;
  }
  screen_byte_P = pcVar1;
  return;
}

Assistant:

void set_colour_bits(void)          // initialise colour functions
{
    if (!teletext)                               // only if in graphics mode
        switch (colour_bits = crt_regs[1] / disp_chars)   // calc bits per pixel
        {
            case 1:
                screen_byte_P = screen_byte_1;
                break; // point screen access func.
            case 2:
                screen_byte_P = screen_byte_2;
                break;
            case 4:
                screen_byte_P = screen_byte_4;
                break;
        }

}